

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadTagSection(BinaryReader *this,Offset section_size)

{
  Index IVar1;
  uint uVar2;
  int iVar3;
  Result RVar4;
  ulong in_RAX;
  char *format;
  uint uVar5;
  Index sig_index;
  Index num_tags;
  undefined8 local_38;
  
  local_38 = in_RAX;
  iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd9])();
  if (iVar3 == 0) {
    RVar4 = ReadCount(this,(Index *)((long)&local_38 + 4),"tag count");
    if (RVar4.enum_ != Error) {
      uVar2 = local_38._4_4_;
      iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xda])
                        (this->delegate_,(ulong)local_38._4_4_);
      if (iVar3 == 0) {
        if (uVar2 != 0) {
          uVar5 = 0;
          do {
            IVar1 = this->num_tag_imports_;
            RVar4 = ReadTagType(this,(Index *)&local_38);
            if (RVar4.enum_ == Error) {
              return (Result)Error;
            }
            iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xdb])
                              (this->delegate_,(ulong)(IVar1 + uVar5),local_38 & 0xffffffff);
            if (iVar3 != 0) {
              format = "OnTagType callback failed";
              goto LAB_00142d35;
            }
            uVar5 = uVar5 + 1;
          } while (uVar2 != uVar5);
        }
        iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xdc])();
        if (iVar3 == 0) {
          return (Result)Ok;
        }
        format = "EndTagSection callback failed";
      }
      else {
        format = "OnTagCount callback failed";
      }
LAB_00142d35:
      PrintError(this,format);
    }
  }
  else {
    PrintError(this,"BeginTagSection callback failed");
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadTagSection(Offset section_size) {
  CALLBACK(BeginTagSection, section_size);
  Index num_tags;
  CHECK_RESULT(ReadCount(&num_tags, "tag count"));
  CALLBACK(OnTagCount, num_tags);

  for (Index i = 0; i < num_tags; ++i) {
    Index tag_index = num_tag_imports_ + i;
    Index sig_index;
    CHECK_RESULT(ReadTagType(&sig_index));
    CALLBACK(OnTagType, tag_index, sig_index);
  }

  CALLBACK(EndTagSection);
  return Result::Ok;
}